

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

Statement * ifStatement(Statement *__return_storage_ptr__,Compiler *compiler)

{
  Expression *pEVar1;
  TokenList *pTVar2;
  Statement *pSVar3;
  uint uVar4;
  Block BVar5;
  Statement local_68;
  
  __return_storage_ptr__->type = STATEMENT_IF;
  (__return_storage_ptr__->field_1).blockStatement.numStatements = (head->value).line;
  (__return_storage_ptr__->field_1).ifStatement.elseBranch.numStatements = 0;
  consume((Token *)&local_68,TOKEN_LEFT_PAREN,
          "Conditionals must start with an openning brace[\'(\'] after If!");
  pEVar1 = expression();
  (__return_storage_ptr__->field_1).ifStatement.condition = pEVar1;
  uVar4 = 1;
  consume((Token *)&local_68,TOKEN_RIGHT_PAREN,
          "Conditional must end with a closing brace[\')\'] after If!");
  consume((Token *)&local_68,TOKEN_NEWLINE,"Expected newline after If!");
  pTVar2 = head;
  if ((head->value).type == TOKEN_INDENT) {
    do {
      pTVar2 = pTVar2->next;
      uVar4 = uVar4 + 1;
    } while ((pTVar2->value).type == TOKEN_INDENT);
    if (uVar4 - compiler->indentLevel != 1) goto LAB_0010428f;
    do {
      consume((Token *)&local_68,TOKEN_INDENT,"Expected indent!");
      uVar4 = uVar4 - 1;
    } while (1 < uVar4);
  }
  else if (compiler->indentLevel != 0) goto LAB_0010428f;
  consume((Token *)&local_68,TOKEN_THEN,"Expected Then on the same indent!");
  consume((Token *)&local_68,TOKEN_NEWLINE,"Expected newline after Then!");
LAB_0010428f:
  BVar5 = blockStatement(compiler,BLOCK_IF);
  (__return_storage_ptr__->field_1).ifStatement.thenBranch = BVar5;
  if (0 < compiler->indentLevel) {
    uVar4 = compiler->indentLevel + 1;
    do {
      consume((Token *)&local_68,TOKEN_INDENT,"Expected indent!");
      uVar4 = uVar4 - 1;
    } while (1 < uVar4);
  }
  if ((head != (TokenList *)0x0) && ((head->value).type == TOKEN_ELSE)) {
    pTVar2 = head->next;
    if ((pTVar2 != (TokenList *)0x0) && (head = pTVar2, (pTVar2->value).type == TOKEN_IF)) {
      if (pTVar2->next != (TokenList *)0x0) {
        head = pTVar2->next;
      }
      ifStatement(&local_68,compiler);
      pSVar3 = (Statement *)malloc(0x40);
      pSVar3->type = local_68.type;
      *(undefined4 *)&pSVar3->field_0x4 = local_68._4_4_;
      *(undefined8 *)&pSVar3->field_1 = local_68.field_1._0_8_;
      (pSVar3->field_1).blockStatement.statements = local_68.field_1.blockStatement.statements;
      *(char **)((long)&pSVar3->field_1 + 0x10) = local_68.field_1.breakStatement.pos.file;
      (pSVar3->field_1).routine.arguments =
           (char **)local_68.field_1.ifStatement.thenBranch.statements;
      *(undefined8 *)((long)&pSVar3->field_1 + 0x20) = local_68.field_1._32_8_;
      *(Statement **)((long)&pSVar3->field_1 + 0x28) =
           local_68.field_1.ifStatement.elseBranch.statements;
      *(Statement **)((long)&pSVar3->field_1 + 0x30) = local_68.field_1.routine.code.statements;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0x100000001;
      *(Statement **)((long)&__return_storage_ptr__->field_1 + 0x28) = pSVar3;
      return pSVar3;
    }
    consume((Token *)&local_68,TOKEN_NEWLINE,"Expected newline after Else!");
    BVar5 = blockStatement(compiler,BLOCK_ELSE);
    (__return_storage_ptr__->field_1).ifStatement.elseBranch = BVar5;
    if (0 < compiler->indentLevel) {
      uVar4 = compiler->indentLevel + 1;
      do {
        consume((Token *)&local_68,TOKEN_INDENT,"Expected indent!");
        uVar4 = uVar4 - 1;
      } while (1 < uVar4);
    }
  }
  consume((Token *)&local_68,TOKEN_ENDIF,"Expected EndIf after If!");
  pSVar3 = (Statement *)consume((Token *)&local_68,TOKEN_NEWLINE,"Expected newline after EndIf!");
  return pSVar3;
}

Assistant:

static Statement ifStatement(Compiler *compiler){
    debug("Parsing if statement");
    Statement s;
    s.type = STATEMENT_IF;
    s.ifStatement.line = presentLine();
    s.ifStatement.thenBranch.numStatements = 0;
    s.ifStatement.elseBranch.numStatements = 0;

    consume(TOKEN_LEFT_PAREN, "Conditionals must start with an openning brace['('] after If!");
    s.ifStatement.condition = expression();
    consume(TOKEN_RIGHT_PAREN, "Conditional must end with a closing brace[')'] after If!");
    consume(TOKEN_NEWLINE, "Expected newline after If!");

    if(getNextIndent() == compiler->indentLevel){
        consumeIndent(compiler->indentLevel);
        consume(TOKEN_THEN, "Expected Then on the same indent!");
        consume(TOKEN_NEWLINE, "Expected newline after Then!");
    }

    s.ifStatement.thenBranch = blockStatement(compiler, BLOCK_IF);
    consumeIndent(compiler->indentLevel);

    if(match(TOKEN_ELSE)){
        if(match(TOKEN_IF)){
            Block elseifBlock = {0, BLOCK_ELSE, NULL};
            addToBlock(&elseifBlock, ifStatement(compiler));
            s.ifStatement.elseBranch = elseifBlock;
        }
        else{
            consume(TOKEN_NEWLINE, "Expected newline after Else!");
            s.ifStatement.elseBranch = blockStatement(compiler, BLOCK_ELSE);
            consumeIndent(compiler->indentLevel);
            consume(TOKEN_ENDIF, "Expected EndIf after If!");
            consume(TOKEN_NEWLINE, "Expected newline after EndIf!");
        }
    }
    else{
        consume(TOKEN_ENDIF, "Expected EndIf after If!");
        consume(TOKEN_NEWLINE, "Expected newline after EndIf!");
    }
    debug("If statement parsed");

    return s;
}